

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiImageClearingTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_0::ImageClearingTestInstance::pipelineImageBarrier
          (ImageClearingTestInstance *this,VkPipelineStageFlags srcStageMask,
          VkPipelineStageFlags dstStageMask,VkAccessFlags srcAccessMask,VkAccessFlags dstAccessMask,
          VkImageLayout oldLayout,VkImageLayout newLayout)

{
  DeviceInterface *pDVar1;
  Handle<(vk::HandleType)9> *pHVar2;
  VkCommandBuffer_s **ppVVar3;
  undefined4 local_70 [2];
  VkImageMemoryBarrier imageBarrier;
  VkImageLayout oldLayout_local;
  VkAccessFlags dstAccessMask_local;
  VkAccessFlags srcAccessMask_local;
  VkPipelineStageFlags dstStageMask_local;
  VkPipelineStageFlags srcStageMask_local;
  ImageClearingTestInstance *this_local;
  
  local_70[0] = 0x2d;
  imageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageBarrier._4_4_ = 0;
  imageBarrier.dstAccessMask = newLayout;
  imageBarrier.oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  imageBarrier.newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  imageBarrier.pNext._0_4_ = srcAccessMask;
  imageBarrier.pNext._4_4_ = dstAccessMask;
  imageBarrier.srcAccessMask = oldLayout;
  imageBarrier._68_4_ = oldLayout;
  pHVar2 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  imageBarrier._32_8_ = pHVar2->m_internal;
  imageBarrier.image.m_internal._0_4_ = this->m_imageAspectFlags;
  imageBarrier.image.m_internal._4_4_ = 0;
  imageBarrier.subresourceRange.aspectMask = 0xffffffff;
  imageBarrier.subresourceRange.baseMipLevel = 0;
  imageBarrier.subresourceRange.levelCount = 1;
  pDVar1 = this->m_vkd;
  ppVVar3 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar1->_vptr_DeviceInterface[0x6d])
            (pDVar1,*ppVVar3,(ulong)srcStageMask,(ulong)dstStageMask,0,0,0,0,0,1,local_70);
  return;
}

Assistant:

void ImageClearingTestInstance::pipelineImageBarrier(VkPipelineStageFlags srcStageMask, VkPipelineStageFlags dstStageMask, VkAccessFlags srcAccessMask, VkAccessFlags dstAccessMask, VkImageLayout oldLayout, VkImageLayout newLayout) const
{
	const VkImageMemoryBarrier		imageBarrier	=
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		srcAccessMask,								// VkAccessFlags			srcAccessMask;
		dstAccessMask,								// VkAccessFlags			dstAccessMask;
		oldLayout,									// VkImageLayout			oldLayout;
		newLayout,									// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32					destQueueFamilyIndex;
		*m_image,									// VkImage					image;
		{
			m_imageAspectFlags,							// VkImageAspectFlags	aspectMask;
			0u,											// deUint32				baseMipLevel;
			VK_REMAINING_MIP_LEVELS,					// deUint32				levelCount;
			0u,											// deUint32				baseArrayLayer;
			1u,											// deUint32				layerCount;
		},											// VkImageSubresourceRange	subresourceRange;
	};

	m_vkd.cmdPipelineBarrier(*m_commandBuffer, srcStageMask, dstStageMask, 0, 0, DE_NULL, 0, DE_NULL, 1, &imageBarrier);
}